

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O1

void __thiscall KDIS::KDataStream::Write<float>(KDataStream *this,float T)

{
  undefined4 *puVar1;
  long lVar2;
  KUINT8 i;
  NetToDataType<float> OctArray;
  KOCTET Temp [4];
  uchar local_21;
  undefined4 local_20;
  float local_1c;
  
  local_20 = T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    puVar1 = &local_20;
    local_1c = T;
    lVar2 = 4;
    do {
      *(undefined1 *)puVar1 = *(undefined1 *)((long)&local_20 + lVar2 + 3);
      puVar1 = (undefined4 *)((long)puVar1 + 1);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = 0;
  do {
    local_21 = *(uchar *)((long)&local_20 + lVar2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_21);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}